

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_gen.c
# Opt level: O1

yajl_gen_status yajl_gen_array_open(yajl_gen g)

{
  yajl_print_t p_Var1;
  void *pvVar2;
  size_t sVar3;
  uint uVar4;
  yajl_gen_status yVar5;
  char *pcVar6;
  
  switch(g->state[g->depth]) {
  case yajl_gen_map_start:
  case yajl_gen_map_key:
    return yajl_gen_keys_must_be_strings;
  case yajl_gen_map_val:
    (*g->print)(g->ctx,":",1);
    if ((g->flags & 1) == 0) goto switchD_00105ffc_caseD_4;
    pcVar6 = " ";
    break;
  default:
    goto switchD_00105ffc_caseD_4;
  case yajl_gen_in_array:
    (*g->print)(g->ctx,",",1);
    if ((g->flags & 1) == 0) goto switchD_00105ffc_caseD_4;
    pcVar6 = "\n";
    break;
  case yajl_gen_complete:
    return yajl_gen_generation_complete;
  case yajl_gen_error:
    return yajl_gen_in_error_state;
  }
  (*g->print)(g->ctx,pcVar6,1);
switchD_00105ffc_caseD_4:
  if ((((g->flags & 1) != 0) && (g->state[g->depth] != yajl_gen_map_val)) && (g->depth != 0)) {
    uVar4 = 0;
    do {
      p_Var1 = g->print;
      pvVar2 = g->ctx;
      pcVar6 = g->indentString;
      sVar3 = strlen(pcVar6);
      (*p_Var1)(pvVar2,pcVar6,sVar3 & 0xffffffff);
      uVar4 = uVar4 + 1;
    } while (uVar4 < g->depth);
  }
  uVar4 = g->depth + 1;
  g->depth = uVar4;
  yVar5 = yajl_max_depth_exceeded;
  if (uVar4 < 0x80) {
    g->state[uVar4] = yajl_gen_array_start;
    (*g->print)(g->ctx,"[",1);
    if ((g->flags & 1) != 0) {
      (*g->print)(g->ctx,"\n",1);
    }
    yVar5 = yajl_gen_status_ok;
    if (((g->flags & 1) != 0) &&
       (yVar5 = yajl_gen_status_ok, g->state[g->depth] == yajl_gen_complete)) {
      (*g->print)(g->ctx,"\n",1);
    }
  }
  return yVar5;
}

Assistant:

yajl_gen_status
yajl_gen_array_open(yajl_gen g)
{
    ENSURE_VALID_STATE; ENSURE_NOT_KEY; INSERT_SEP; INSERT_WHITESPACE;
    INCREMENT_DEPTH;
    g->state[g->depth] = yajl_gen_array_start;
    g->print(g->ctx, "[", 1);
    if ((g->flags & yajl_gen_beautify)) g->print(g->ctx, "\n", 1);
    FINAL_NEWLINE;
    return yajl_gen_status_ok;
}